

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

int32_t u_terminateUChar32s_63
                  (UChar32 *dest,int32_t destCapacity,int32_t length,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UErrorCode *pErrorCode_local;
  int32_t length_local;
  int32_t destCapacity_local;
  UChar32 *dest_local;
  
  if (((pErrorCode != (UErrorCode *)0x0) && (UVar1 = U_SUCCESS(*pErrorCode), UVar1 != '\0')) &&
     (-1 < length)) {
    if (length < destCapacity) {
      dest[length] = 0;
      if (*pErrorCode == U_STRING_NOT_TERMINATED_WARNING) {
        *pErrorCode = U_ZERO_ERROR;
      }
    }
    else if (length == destCapacity) {
      *pErrorCode = U_STRING_NOT_TERMINATED_WARNING;
    }
    else {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
    }
  }
  return length;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_terminateUChar32s(UChar32 *dest, int32_t destCapacity, int32_t length, UErrorCode *pErrorCode) {
    __TERMINATE_STRING(dest, destCapacity, length, pErrorCode);
    return length;
}